

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cl_generator.cc
# Opt level: O0

void __thiscall t_cl_generator::init_generator(t_cl_generator *this)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  int __oflag;
  int __oflag_00;
  int __oflag_01;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  string f_asd_name;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined1 local_1d8 [8];
  string f_vars_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [8];
  string f_types_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  int local_10c;
  undefined1 local_108 [4];
  int r_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string program_dir;
  undefined1 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [36];
  int local_14;
  t_cl_generator *ptStack_10;
  int r;
  t_cl_generator *this_local;
  
  ptStack_10 = this;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_38);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = mkdir(pcVar2,0x1ff);
  std::__cxx11::string::~string(local_38);
  local_14 = iVar1;
  if (iVar1 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      program_dir.field_2._M_local_buf[10] = '\x01';
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_98);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_78,pcVar2,(allocator *)(program_dir.field_2._M_local_buf + 0xb));
      std::operator+(&local_58,&local_78,": ");
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      std::operator+(pbVar4,&local_58,pcVar2);
      program_dir.field_2._M_local_buf[10] = '\0';
      __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])();
  std::operator+(&local_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,"/")
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 &local_e8,&(this->super_t_oop_generator).super_t_generator.program_name_);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)local_108);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_10c = mkdir(pcVar2,0x1ff);
  if (local_10c == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      f_types_name.field_2._M_local_buf[0xe] = '\x01';
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_150,pcVar2,(allocator *)(f_types_name.field_2._M_local_buf + 0xf))
      ;
      std::operator+(&local_130,&local_150,": ");
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      std::operator+(pbVar4,&local_130,pcVar2);
      f_types_name.field_2._M_local_buf[0xe] = '\0';
      __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  this->temporary_var = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&f_vars_name.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,"/");
  std::operator+(&local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&f_vars_name.field_2 + 8),
                 &(this->super_t_oop_generator).super_t_generator.program_name_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                 &local_198,"-types.lisp");
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)(f_vars_name.field_2._M_local_buf + 8));
  std::operator+(&local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,"/");
  std::operator+(&local_1f8,&local_218,
                 &(this->super_t_oop_generator).super_t_generator.program_name_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 &local_1f8,"-vars.lisp");
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_types_,local_178,__oflag);
  cl_autogen_comment_abi_cxx11_(&local_238,this);
  poVar5 = std::operator<<((ostream *)&this->f_types_,(string *)&local_238);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_238);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&this->f_vars_,local_1d8,__oflag_00);
  cl_autogen_comment_abi_cxx11_((string *)((long)&f_asd_name.field_2 + 8),this);
  poVar5 = std::operator<<((ostream *)&this->f_vars_,(string *)(f_asd_name.field_2._M_local_buf + 8)
                          );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)(f_asd_name.field_2._M_local_buf + 8));
  package_def(this,(ostream *)&this->f_types_);
  package_in(this,(ostream *)&this->f_types_);
  package_in(this,(ostream *)&this->f_vars_);
  if ((this->no_asd & 1U) == 0) {
    std::operator+(&local_2d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,"/"
                  );
    std::operator+(&local_2b8,&local_2d8,&this->system_prefix);
    std::operator+(&local_298,&local_2b8,
                   &(this->super_t_oop_generator).super_t_generator.program_name_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                   &local_298,".asd");
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (&this->f_asd_,local_278,__oflag_01);
    cl_autogen_comment_abi_cxx11_(&local_2f8,this);
    poVar5 = std::operator<<((ostream *)&this->f_asd_,(string *)&local_2f8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_2f8);
    asdf_def(this,(ostream *)&this->f_asd_);
    std::__cxx11::string::~string((string *)local_278);
  }
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)local_178);
  std::__cxx11::string::~string((string *)local_c8);
  return;
}

Assistant:

void t_cl_generator::init_generator() {
  MKDIR(get_out_dir().c_str());
  string program_dir = get_out_dir() + "/" + program_name_;
  MKDIR(program_dir.c_str());

  temporary_var = 0;

  string f_types_name = program_dir + "/" + program_name_ + "-types.lisp";
  string f_vars_name = program_dir + "/" + program_name_ + "-vars.lisp";

  f_types_.open(f_types_name);
  f_types_ << cl_autogen_comment() << endl;
  f_vars_.open(f_vars_name);
  f_vars_ << cl_autogen_comment() << endl;

  package_def(f_types_);
  package_in(f_types_);
  package_in(f_vars_);

  if (!no_asd) {
    string f_asd_name = program_dir + "/" + system_prefix + program_name_ + ".asd";
    f_asd_.open(f_asd_name);
    f_asd_ << cl_autogen_comment() << endl;
    asdf_def(f_asd_);
  }
}